

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_uuid.cpp
# Opt level: O3

ON_wString ON_AddIdSuffixToString(wchar_t *source,wchar_t *separator,ON_UUID id)

{
  ON_UUID id_00;
  ON_wString in_RAX;
  uchar unaff_RBX [8];
  
  ON_wString::ON_wString((ON_wString *)source,separator);
  ON_wString::operator+=((ON_wString *)source,id._0_8_);
  id_00.Data4[0] = unaff_RBX[0];
  id_00.Data4[1] = unaff_RBX[1];
  id_00.Data4[2] = unaff_RBX[2];
  id_00.Data4[3] = unaff_RBX[3];
  id_00.Data4[4] = unaff_RBX[4];
  id_00.Data4[5] = unaff_RBX[5];
  id_00.Data4[6] = unaff_RBX[6];
  id_00.Data4[7] = unaff_RBX[7];
  id_00._0_8_ = in_RAX.m_s;
  ON_IdToString(id_00);
  ON_wString::operator+=((ON_wString *)source,(ON_wString *)&stack0xffffffffffffffd8);
  ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffffd8);
  return (ON_wString)source;
}

Assistant:

ON_DECL
const ON_wString ON_AddIdSuffixToString(
  const wchar_t* source,
  const wchar_t* separator,
  const ON_UUID id
)
{
  ON_wString s(source);
  s += separator;
  s += ON_IdToString(id);
  return s;

}